

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t strcmpMax(UChar *s,int32_t length,UChar *t,int32_t max)

{
  int iVar1;
  UChar *pUVar2;
  int32_t c2;
  int32_t c1;
  int32_t max_local;
  UChar *t_local;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *s_local;
  
  _c1 = t;
  t_local._4_4_ = length;
  pUStack_18 = s;
  while( true ) {
    pUVar2 = _c1 + 1;
    if ((ushort)*_c1 == 0) {
      return 1;
    }
    iVar1 = (uint)(ushort)*pUStack_18 - (uint)(ushort)*_c1;
    if (iVar1 != 0) break;
    t_local._4_4_ = t_local._4_4_ + -1;
    _c1 = pUVar2;
    pUStack_18 = pUStack_18 + 1;
    if (t_local._4_4_ < 1) {
      if ((max - length == 0) || (*pUVar2 == L'\0')) {
        s_local._4_4_ = 0;
      }
      else {
        s_local._4_4_ = -(max - length);
      }
      return s_local._4_4_;
    }
  }
  return iVar1;
}

Assistant:

static inline int32_t
strcmpMax(const UChar *s, int32_t length, const UChar *t, int32_t max) {
    int32_t c1, c2;

    max-=length; /* we require length<=max, so no need to decrement max in the loop */
    do {
        c1=*s++;
        c2=*t++;
        if(c2==0) {
            return 1; /* reached the end of t but not of s */
        }
        c1-=c2;
        if(c1!=0) {
            return c1; /* return difference result */
        }
    } while(--length>0);
    /* ends with length==0 */

    if(max==0 || *t==0) {
        return 0; /* equal to length of both strings */
    } else {
        return -max; /* return lengh difference */
    }
}